

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picPageAnalyzer.cpp
# Opt level: O1

int __thiscall picPageAnalyzer::getCurrentPageNumber(picPageAnalyzer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  _Alloc_hider __nptr;
  int *piVar3;
  long lVar4;
  undefined8 uVar5;
  string local_98;
  string local_78;
  string local_58;
  char *local_38;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"span","");
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  pageAnalyzer::getInfoFromContent
            (&local_58,&this->super_pageAnalyzer,&local_98,1,0x11,&local_78,'\0');
  __nptr._M_p = local_58._M_dataplus._M_p;
  piVar3 = __errno_location();
  iVar2 = *piVar3;
  *piVar3 = 0;
  lVar4 = strtol(__nptr._M_p,&local_38,10);
  if (local_38 == __nptr._M_p) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar4 == lVar4) && (*piVar3 != 0x22)) {
    if (*piVar3 == 0) {
      *piVar3 = iVar2;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    return (int)lVar4;
  }
  uVar5 = std::__throw_out_of_range("stoi");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar5);
}

Assistant:

int picPageAnalyzer::getCurrentPageNumber()
{
    return stoi(this->getInfoFromContent(std::string("span"), 1, GETMODE_ALL, std::string(""), '\0'));
}